

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O1

Int128 * helper_atomic_cmpxchgo_le_mmu_mips
                   (Int128 *__return_storage_ptr__,CPUArchState_conflict5 *env,
                   target_ulong_conflict addr,Int128 cmpv,Int128 newv,TCGMemOpIdx oi,
                   uintptr_t retaddr)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  Int128 *pIVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined8 in_R9;
  
  pIVar3 = (Int128 *)CONCAT44(in_register_00000014,addr);
  auVar1._12_4_ = in_register_0000000c;
  auVar1._8_4_ = oi;
  pauVar2 = (undefined1 (*) [16])
            atomic_mmu_lookup((CPUArchState_conflict5 *)__return_storage_ptr__,
                              (target_ulong_conflict)env,(TCGMemOpIdx)cmpv,cmpv._8_8_);
  LOCK();
  auVar1._0_8_ = pIVar3;
  if (auVar1 == *pauVar2) {
    *(uintptr_t *)*pauVar2 = retaddr;
    *(undefined8 *)(*pauVar2 + 8) = in_R9;
  }
  else {
    pIVar3 = SUB168(*pauVar2,0);
  }
  UNLOCK();
  return pIVar3;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}